

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O1

void __thiscall
embree::ParallelRadixSort<unsigned_long,_unsigned_long>::tbbRadixIteration0
          (ParallelRadixSort<unsigned_long,_unsigned_long> *this,unsigned_long shift,
          unsigned_long *src,unsigned_long *dst,size_t threadIndex,size_t threadCount)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  lVar2 = *(long *)(this + 0x18);
  lVar5 = 0;
  do {
    *(undefined4 *)(*(long *)this + threadIndex * 0x400 + lVar5 * 4) = 0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  uVar3 = (lVar2 * threadIndex) / threadCount;
  uVar4 = ((threadIndex + 1) * lVar2) / threadCount;
  if (uVar3 < uVar4) {
    lVar2 = *(long *)this;
    do {
      piVar1 = (int *)(threadIndex * 0x400 + lVar2 + (src[uVar3] >> ((byte)shift & 0x3f) & 0xff) * 4
                      );
      *piVar1 = *piVar1 + 1;
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar4);
  }
  return;
}

Assistant:

void tbbRadixIteration0(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* count how many items go into the buckets */
      for (size_t i=0; i<BUCKETS; i++)
        radixCount[threadIndex][i] = 0;

      /* iterate over src array and count buckets */
      unsigned int * __restrict const count = radixCount[threadIndex];
#if defined(__INTEL_COMPILER)
#pragma nounroll      
#endif
      for (size_t i=startID; i<endID; i++) {
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const Key index = ((Key)src[i] >> shift) & mask;
#endif
        count[index]++;
      }
    }